

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CropResizeLayerParams::MergePartialFromCodedStream
          (CropResizeLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  int iVar7;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  unsigned_long uVar8;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  float fVar12;
  pair<unsigned_long,_bool> pVar13;
  float local_3c;
  RepeatedField<unsigned_long> *local_38;
  
  local_38 = &this->targetsize_;
LAB_0048c568:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0048c58b;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0048c58b:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_0048c5e8_default;
    cVar10 = (char)uVar11;
    switch((uint)(uVar11 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar10 == '\b') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,10,input,local_38);
      }
      else {
        if ((uVar6 & 0xff) != 10) break;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,local_38);
      }
      goto LAB_0048c5cc;
    case 2:
      if (cVar10 == '\x10') {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar13.first;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->normalizedcoordinates_ = uVar8 != 0;
        goto LAB_0048c568;
      }
      break;
    case 3:
      if (cVar10 != '\x1a') break;
      this_00 = this->mode_;
      if (this_00 == (SamplingMode *)0x0) {
        this_00 = (SamplingMode *)operator_new(0x18);
        SamplingMode::SamplingMode(this_00);
        this->mode_ = this_00;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = SamplingMode::MergePartialFromCodedStream(this_00,input);
LAB_0048c789:
      if (bVar5 == false) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
      goto LAB_0048c5cc;
    case 4:
      if (cVar10 == '\"') {
        this_01 = this->boxindicesmode_;
        if (this_01 == (BoxCoordinatesMode *)0x0) {
          this_01 = (BoxCoordinatesMode *)operator_new(0x18);
          BoxCoordinatesMode::BoxCoordinatesMode(this_01);
          this->boxindicesmode_ = this_01;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = BoxCoordinatesMode::MergePartialFromCodedStream(this_01,input);
        goto LAB_0048c789;
      }
      break;
    case 5:
      if (cVar10 == '-') {
        pfVar3 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_3c);
          fVar12 = local_3c;
          if (!bVar5) {
            return false;
          }
        }
        else {
          fVar12 = *pfVar3;
          input->buffer_ = (uint8 *)(pfVar3 + 1);
        }
        this->spatialscale_ = fVar12;
        goto LAB_0048c568;
      }
    }
switchD_0048c5e8_default:
    if (uVar6 == 0) {
      return true;
    }
    if ((uVar6 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_0048c5cc:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool CropResizeLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CropResizeLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated uint64 targetSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_targetsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 10u, input, this->mutable_targetsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool normalizedCoordinates = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &normalizedcoordinates_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamplingMode mode = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mode()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_boxindicesmode()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float spatialScale = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &spatialscale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CropResizeLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CropResizeLayerParams)
  return false;
#undef DO_
}